

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O1

void Inta_ManPrintClause(Inta_Man_t *p,Sto_Cls_t *pClause)

{
  ulong uVar1;
  
  printf("Clause ID = %d. Proof = %d. {",(long)pClause->Id,(ulong)(uint)p->pProofNums[pClause->Id]);
  if ((*(uint *)&pClause->field_0x1c & 0x7fffff8) != 0) {
    uVar1 = 0;
    do {
      printf(" %d",(ulong)*(uint *)((long)&pClause[1].pNext + uVar1 * 4));
      uVar1 = uVar1 + 1;
    } while (uVar1 < (*(uint *)&pClause->field_0x1c >> 3 & 0xffffff));
  }
  puts(" }");
  return;
}

Assistant:

void Inta_ManPrintClause( Inta_Man_t * p, Sto_Cls_t * pClause )
{
    int i;
    printf( "Clause ID = %d. Proof = %d. {", pClause->Id, Inta_ManProofGet(p, pClause) );
    for ( i = 0; i < (int)pClause->nLits; i++ )
        printf( " %d", pClause->pLits[i] );
    printf( " }\n" );
}